

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QLayoutItem * __thiscall
QMainWindowLayout::unplug(QMainWindowLayout *this,QWidget *widget,DragScope scope)

{
  QMainWindowLayoutState *this_00;
  QMainWindowLayoutState *other;
  QToolBarAreaLayout *this_01;
  QMainWindowLayout *pQVar1;
  QArrayDataPointer<QDockAreaLayoutItem> *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Representation RVar6;
  QDebug QVar7;
  undefined4 uVar8;
  Data *this_02;
  bool bVar9;
  DockWidgetArea DVar10;
  int iVar11;
  int iVar12;
  QWidget *pQVar13;
  QLayout *pQVar14;
  QDockAreaLayoutItem *pQVar15;
  QLoggingCategory *pQVar16;
  QLayoutItem *pQVar17;
  long lVar18;
  QDockAreaLayoutInfo *pQVar19;
  QStyle *pQVar20;
  int iVar21;
  int *piVar22;
  char cVar23;
  QArrayDataPointer<QToolBarAreaLayoutLine> *this_03;
  QDebug *this_04;
  undefined1 auVar24 [8];
  int iVar25;
  QArrayDataPointer<QToolBarAreaLayoutLine> *this_05;
  long in_FS_OFFSET;
  QRect QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QLayoutItem *item;
  QDockAreaLayoutItem parentItem;
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  undefined1 local_f0 [8];
  int local_e8;
  int iStack_e4;
  undefined4 uStack_e0;
  undefined8 uStack_dc;
  undefined4 local_d4;
  QWidgetData *local_d0;
  QDebug local_c8;
  undefined1 local_c0 [8];
  QDebug local_b8;
  QLayoutItem *local_b0;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  undefined1 *local_98;
  undefined1 local_90 [8];
  QArrayDataPointer<int> local_88;
  undefined1 local_68 [32];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar13 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
  if ((pQVar13 == (QWidget *)0x0) ||
     (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
    this_00 = (QMainWindowLayoutState *)(this + 0x88);
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QMainWindowLayoutState::indexOf((QList<int> *)&local_88,this_00,widget);
    if ((undefined1 *)local_88.size == (undefined1 *)0x0) {
      pQVar17 = (QLayoutItem *)0x0;
    }
    else {
      pQVar17 = QMainWindowLayoutState::item(this_00,(QList<int> *)&local_88);
      local_b0 = pQVar17;
      if (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        uStack_a0 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
        local_a8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        _local_a8 = QMainWindowLayoutState::itemRect(this_00,(QList<int> *)&local_88);
        other = (QMainWindowLayoutState *)(this + 0x3c0);
        *(undefined8 *)(this + 0x3c0) = *(undefined8 *)&this_00->rect;
        *(undefined8 *)(this + 0x3c8) = *(undefined8 *)(this + 0x90);
        *(undefined8 *)(this + 0x3d0) = *(undefined8 *)(this + 0x98);
        this_01 = (QToolBarAreaLayout *)(this + 0x3d8);
        *(undefined8 *)(this + 0x3d8) = *(undefined8 *)(this + 0xa0);
        *(undefined8 *)(this + 0x3e0) = *(undefined8 *)(this + 0xa8);
        *(undefined8 *)(this + 1000) = *(undefined8 *)(this + 0xb0);
        this_05 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)(this + 0x3f0);
        lVar18 = 4;
        this_03 = this_05;
        do {
          QArrayDataPointer<QToolBarAreaLayoutLine>::operator=
                    (this_03,(QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_03[-0x23].size);
          uVar3 = *(undefined8 *)((long)&this_03[-0x21].d + 1);
          uVar4 = *(undefined8 *)((long)&this_03[-0x21].ptr + 1);
          this_03[1].d = (Data *)this_03[-0x22].size;
          this_03[1].ptr = (QToolBarAreaLayoutLine *)this_03[-0x21].d;
          *(undefined8 *)((long)&this_03[1].ptr + 1) = uVar3;
          *(undefined8 *)((long)&this_03[1].size + 1) = uVar4;
          this_03 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_03[2].ptr;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
        this[0x4d0] = this[0x198];
        *(undefined8 *)(this + 0x4d8) = *(undefined8 *)(this + 0x1a0);
        *(undefined8 *)(this + 0x4e0) = *(undefined8 *)(this + 0x1a8);
        *(undefined8 *)(this + 0x4e8) = *(undefined8 *)(this + 0x1b0);
        *(undefined8 *)(this + 0x4f0) = *(undefined8 *)(this + 0x1b8);
        *(undefined8 *)(this + 0x4f8) = *(undefined8 *)(this + 0x1c0);
        *(undefined8 *)(this + 0x500) = *(undefined8 *)(this + 0x1c8);
        *(undefined8 *)(this + 0x508) = *(undefined8 *)(this + 0x1d0);
        *(undefined8 *)(this + 0x510) = *(undefined8 *)(this + 0x1d8);
        lVar18 = 0x1e0;
        do {
          pQVar1 = this + lVar18;
          *(undefined8 *)(pQVar1 + 0x338) = *(undefined8 *)pQVar1;
          QArrayDataPointer<QWidget_*>::operator=
                    ((QArrayDataPointer<QWidget_*> *)(pQVar1 + 0x340),
                     (QArrayDataPointer<QWidget_*> *)(this + lVar18 + 8));
          uVar3 = *(undefined8 *)(this + lVar18 + 0x28);
          uVar4 = *(undefined8 *)(this + lVar18 + 0x30);
          uVar5 = *(undefined8 *)(this + lVar18 + 0x38);
          *(undefined8 *)(pQVar1 + 0x358) = *(undefined8 *)(this + lVar18 + 0x20);
          *(undefined8 *)(pQVar1 + 0x360) = uVar3;
          *(undefined8 *)(pQVar1 + 0x368) = uVar4;
          *(undefined8 *)(pQVar1 + 0x370) = uVar5;
          pQVar2 = (QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar18 + 0x378);
          QArrayDataPointer<QDockAreaLayoutItem>::operator=
                    (pQVar2,(QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar18 + 0x40));
          pQVar15 = *(QDockAreaLayoutItem **)(this + lVar18 + 0x60);
          pQVar2[1].d = *(Data **)(this + lVar18 + 0x58);
          pQVar2[1].ptr = pQVar15;
          *(undefined4 *)&pQVar2[1].size = *(undefined4 *)(this + lVar18 + 0x68);
          lVar18 = lVar18 + 0x70;
        } while (lVar18 != 0x3a0);
        this[0x6dc] = this[0x3a4];
        *(undefined4 *)(this + 0x6d8) = *(undefined4 *)(this + 0x3a0);
        QArrayDataPointer<QWidget_*>::operator=
                  ((QArrayDataPointer<QWidget_*> *)(this + 0x6e0),
                   (QArrayDataPointer<QWidget_*> *)(this + 0x3a8));
        pQVar13 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
        if (pQVar13 != (QWidget *)0x0) {
          if (((scope == Group) && (((byte)this[0x700] & 0x20) != 0)) &&
             ((undefined1 *)0x3 < (ulong)local_88.size)) {
            QList<int>::mid((QList<int> *)local_68,(QList<int> *)&local_88,1,
                            (qsizetype)(local_88.size + -2));
            pQVar15 = QDockAreaLayout::item
                                ((QDockAreaLayout *)(this + 0x1a0),(QList<int> *)local_68);
            bVar9 = unplugGroup((QMainWindowLayout *)this,&local_b0,pQVar15);
            piVar22 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
            if (piVar22 != (int *)0x0) {
              LOCK();
              *piVar22 = *piVar22 + -1;
              UNLOCK();
              if (*piVar22 == 0) {
                QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),4,0x10)
                ;
              }
            }
            if (bVar9) {
              if ((&(local_88.d)->super_QArrayData == (QArrayData *)0x0) ||
                 (1 < ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
              {
                QArrayDataPointer<int>::reallocateAndGrow
                          (&local_88,GrowsAtEnd,0,(QArrayDataPointer<int> *)0x0);
              }
              local_88.size = local_88.size + -1;
              *(undefined8 *)(this + 0x3d0) = *(undefined8 *)(this + 0x98);
              RVar6.m_i = (this_00->rect).y1.m_i;
              uVar3 = *(undefined8 *)(this + 0x90);
              (other->rect).x1 = (Representation)(this_00->rect).x1.m_i;
              (other->rect).y1 = (Representation)RVar6.m_i;
              *(undefined8 *)(this + 0x3c8) = uVar3;
              *(undefined8 *)(this + 1000) = *(undefined8 *)(this + 0xb0);
              uVar3 = *(undefined8 *)(this + 0xa0);
              uVar4 = *(undefined8 *)(this + 0xa8);
              (this_01->rect).x1 = (Representation)(int)uVar3;
              (this_01->rect).y1 = (Representation)(int)((ulong)uVar3 >> 0x20);
              *(undefined8 *)(this + 0x3e0) = uVar4;
              lVar18 = 4;
              do {
                QArrayDataPointer<QToolBarAreaLayoutLine>::operator=
                          (this_05,(QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_05[-0x23].size
                          );
                uVar3 = *(undefined8 *)((long)&this_05[-0x21].d + 1);
                uVar4 = *(undefined8 *)((long)&this_05[-0x21].ptr + 1);
                this_05[1].d = (Data *)this_05[-0x22].size;
                this_05[1].ptr = (QToolBarAreaLayoutLine *)this_05[-0x21].d;
                *(undefined8 *)((long)&this_05[1].ptr + 1) = uVar3;
                *(undefined8 *)((long)&this_05[1].size + 1) = uVar4;
                this_05 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_05[2].ptr;
                lVar18 = lVar18 + -1;
              } while (lVar18 != 0);
              this[0x4d0] = this[0x198];
              uVar3 = *(undefined8 *)((QDockAreaLayout *)(this + 0x1a0))->corners;
              uVar4 = *(undefined8 *)(this + 0x1a8);
              *(undefined8 *)(this + 0x508) = *(undefined8 *)(this + 0x1d0);
              *(undefined8 *)(this + 0x510) = *(undefined8 *)(this + 0x1d8);
              *(undefined8 *)(this + 0x4f8) = *(undefined8 *)(this + 0x1c0);
              *(undefined8 *)(this + 0x500) = *(undefined8 *)(this + 0x1c8);
              *(undefined8 *)(this + 0x4e8) = *(undefined8 *)(this + 0x1b0);
              *(undefined8 *)(this + 0x4f0) = *(undefined8 *)(this + 0x1b8);
              *(undefined8 *)((QDockAreaLayout *)(this + 0x4d8))->corners = uVar3;
              *(undefined8 *)(this + 0x4e0) = uVar4;
              lVar18 = 0;
              do {
                *(undefined8 *)(this + lVar18 + 0x518) = *(undefined8 *)(this + lVar18 + 0x1e0);
                QArrayDataPointer<QWidget_*>::operator=
                          ((QArrayDataPointer<QWidget_*> *)(this + lVar18 + 0x520),
                           (QArrayDataPointer<QWidget_*> *)(this + lVar18 + 0x1e8));
                *(undefined8 *)(this + lVar18 + 0x538) = *(undefined8 *)(this + lVar18 + 0x200);
                *(undefined8 *)(this + lVar18 + 0x540) = *(undefined8 *)(this + lVar18 + 0x208);
                *(undefined8 *)(this + lVar18 + 0x548) = *(undefined8 *)(this + lVar18 + 0x210);
                *(undefined8 *)(this + lVar18 + 0x550) = *(undefined8 *)(this + lVar18 + 0x218);
                pQVar2 = (QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar18 + 0x558);
                QArrayDataPointer<QDockAreaLayoutItem>::operator=
                          (pQVar2,(QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar18 + 0x220))
                ;
                pQVar15 = *(QDockAreaLayoutItem **)(this + lVar18 + 0x240);
                pQVar2[1].d = *(Data **)(this + lVar18 + 0x238);
                pQVar2[1].ptr = pQVar15;
                *(undefined4 *)&pQVar2[1].size = *(undefined4 *)(this + lVar18 + 0x248);
                lVar18 = lVar18 + 0x70;
              } while (lVar18 != 0x1c0);
              this[0x6dc] = this[0x3a4];
              *(undefined4 *)(this + 0x6d8) = *(undefined4 *)(this + 0x3a0);
              QArrayDataPointer<QWidget_*>::operator=
                        ((QArrayDataPointer<QWidget_*> *)(this + 0x6e0),
                         (QArrayDataPointer<QWidget_*> *)(this + 0x3a8));
              goto LAB_0042f7fb;
            }
          }
          DVar10 = dockWidgetArea(this,pQVar13);
          piVar22 = (int *)(local_a8 + 0xc);
          if (DVar10 - LeftDockWidgetArea < 2) {
LAB_0042f46f:
            *piVar22 = *piVar22 - *(int *)(this + 0x760);
          }
          else if ((DVar10 == BottomDockWidgetArea) || (DVar10 == TopDockWidgetArea)) {
            piVar22 = (int *)(local_a8 + 8);
            goto LAB_0042f46f;
          }
          QWidget::layout(pQVar13);
          lVar18 = QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
          if (lVar18 == 0) {
            cVar23 = '\0';
          }
          else {
            cVar23 = *(char *)(lVar18 + 0x1c);
          }
          pQVar20 = QApplication::style();
          if (pQVar20 == (QStyle *)0x0) {
            iVar11 = 0x14;
          }
          else {
            pQVar20 = QApplication::style();
            iVar11 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x1a,0,pQVar13);
          }
          iVar21 = iVar11 * 2;
          if (cVar23 != '\0') {
            iVar21 = iVar11;
            iVar11 = iVar11 * 2;
          }
          uVar8 = local_a8._4_4_;
          iVar12 = (uStack_a0._0_4_ - local_a8._0_4_) + 1;
          iVar25 = (uStack_a0._4_4_ - local_a8._4_4_) + 1;
          if (iVar12 <= iVar21) {
            iVar12 = iVar21;
          }
          if (iVar25 <= iVar11) {
            iVar25 = iVar11;
          }
          iVar11 = local_a8._0_4_ + -1;
          uStack_a0._0_4_ = iVar11 + iVar12;
          uStack_a0._4_4_ = uVar8 + iVar25 + -1;
          pQVar16 = QtPrivateLogging::lcQpaDockWidgets();
          if (((pQVar16->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
            local_68._24_8_ = pQVar16->name;
            local_68._0_4_ = 2;
            local_68._4_4_ = 0;
            local_68._8_4_ = 0;
            local_68._12_4_ = 0;
            local_68._16_4_ = 0;
            local_68._20_4_ = 0;
            QMessageLogger::debug();
            ::operator<<((Stream *)&local_b8,(QDockWidget *)local_108);
            QVar7.stream = local_b8.stream;
            QVar33.m_data = (storage_type *)0x1b;
            QVar33.m_size = (qsizetype)&local_e8;
            QString::fromUtf8(QVar33);
            QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)&local_e8);
            piVar22 = (int *)CONCAT44(iStack_e4,local_e8);
            if (piVar22 != (int *)0x0) {
              LOCK();
              *piVar22 = *piVar22 + -1;
              UNLOCK();
              if (*piVar22 == 0) {
                QArrayData::deallocate((QArrayData *)CONCAT44(iStack_e4,local_e8),2,0x10);
              }
            }
            if (*(QTextStream *)(local_b8.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_b8.stream,' ');
            }
            *(int *)((QTextStream *)local_b8.stream + 0x28) =
                 *(int *)((QTextStream *)local_b8.stream + 0x28) + 1;
            local_e8 = (uStack_a0._0_4_ - local_a8._0_4_) + 1;
            iStack_e4 = (uStack_a0._4_4_ - local_a8._4_4_) + 1;
            ::operator<<((Stream *)local_f8,(QSize *)(local_108 + 8));
            QDebug::~QDebug((QDebug *)local_f8);
            QDebug::~QDebug((QDebug *)(local_108 + 8));
            QDebug::~QDebug(&local_b8);
            QDebug::~QDebug((QDebug *)local_108);
          }
          QDockWidgetPrivate::unplug(*(QDockWidgetPrivate **)&pQVar13->field_0x8,(QRect *)local_a8);
        }
LAB_0042f7fb:
        lVar18 = QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
        if (lVar18 != 0) {
          QToolBarPrivate::unplug(*(QToolBarPrivate **)(lVar18 + 8),(QRect *)local_a8);
        }
        QMainWindowLayoutState::unplug(this_00,(QList<int> *)&local_88,other);
        RVar6.m_i = (other->rect).y1.m_i;
        uVar3 = *(undefined8 *)(this + 0x3c8);
        (this_01->rect).x1 = (Representation)(other->rect).x1.m_i;
        (this_01->rect).y1 = (Representation)RVar6.m_i;
        *(undefined8 *)(this + 0x3e0) = uVar3;
        QVar26 = QToolBarAreaLayout::fitLayout(this_01);
        *(QRect *)(this + 0x4e8) = QVar26;
        QDockAreaLayout::fitLayout((QDockAreaLayout *)(this + 0x4d8));
        QArrayDataPointer<int>::operator=((QArrayDataPointer<int> *)(this + 0x7b0),&local_88);
        *(undefined1 (*) [8])(this + 0x7c8) = local_a8;
        *(QWidgetData **)(this + 2000) = uStack_a0;
        updateGapIndicator(this);
        pQVar17 = local_b0;
        fixToolBarOrientation(local_b0,*(int *)(*(long *)(this + 0x7b8) + 4));
      }
    }
    if (&(local_88.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0042f8d0;
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar11 = ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    auVar24 = (undefined1  [8])local_88.d;
joined_r0x0042f8b7:
    if (iVar11 != 0) goto LAB_0042f8d0;
  }
  else {
    if ((scope != Group) ||
       (pQVar19 = QDockWidgetGroupWindow::tabLayoutInfo((QDockWidgetGroupWindow *)pQVar13),
       pQVar19 == (QDockAreaLayoutInfo *)0x0)) {
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_a0 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      pQVar14 = QWidget::layout(pQVar13);
      QDockAreaLayoutInfo::indexOf
                ((QList<int> *)local_a8,(QDockAreaLayoutInfo *)&pQVar14[4].super_QLayoutItem,widget)
      ;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_68._16_4_ = 0xaaaaaaaa;
      local_68._20_4_ = 0xaaaaaaaa;
      local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._0_4_ = 0xaaaaaaaa;
      local_68._4_4_ = 0xaaaaaaaa;
      local_68._8_4_ = 0xaaaaaaaa;
      local_68._12_4_ = 0xaaaaaaaa;
      pQVar14 = QWidget::layout(pQVar13);
      pQVar15 = QDockAreaLayoutInfo::item
                          ((QDockAreaLayoutInfo *)&pQVar14[4].super_QLayoutItem,
                           (QList<int> *)local_a8);
      QDockAreaLayoutItem::QDockAreaLayoutItem((QDockAreaLayoutItem *)local_68,pQVar15);
      local_b0 = (QLayoutItem *)CONCAT44(local_68._4_4_,local_68._0_4_);
      if ((scope == Group) &&
         (((undefined1 *)0x1 < local_98 &&
          (bVar9 = unplugGroup((QMainWindowLayout *)this,&local_b0,(QDockAreaLayoutItem *)local_68),
          bVar9)))) {
        pQVar16 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar16->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_d0 = (QWidgetData *)pQVar16->name;
          local_e8 = 2;
          iStack_e4 = 0;
          uStack_e0._0_1_ = (QPaintDevice)0x0;
          uStack_e0._1_3_ = 0;
          uStack_dc = 0;
          local_d4 = 0;
          QMessageLogger::debug();
          QVar7.stream = local_c8.stream;
          QVar27.m_data = &DAT_0000000b;
          QVar27.m_size = (qsizetype)&local_88;
          QString::fromUtf8(QVar27);
          QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)&local_88);
          if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
            }
          }
          if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
          }
          *(int *)((QTextStream *)local_c8.stream + 0x28) =
               *(int *)((QTextStream *)local_c8.stream + 0x28) + 1;
          ::operator<<((Stream *)&local_b8,(QWidget *)local_c0);
          QVar7.stream = local_b8.stream;
          QVar28.m_data = (storage_type *)0x4;
          QVar28.m_size = (qsizetype)&local_88;
          QString::fromUtf8(QVar28);
          QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)&local_88);
          if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
            }
          }
          if (*(QTextStream *)(local_b8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_b8.stream,' ');
          }
          QTextStream::operator<<((QTextStream *)local_b8.stream,local_b0);
          if (*(QTextStream *)(local_b8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_b8.stream,' ');
          }
          QDebug::~QDebug(&local_b8);
          this_04 = (QDebug *)local_c0;
LAB_0042f366:
          QDebug::~QDebug(this_04);
          QDebug::~QDebug(&local_c8);
        }
      }
      else {
        lVar18 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
        QDockWidgetPrivate::unplug(*(QDockWidgetPrivate **)(lVar18 + 8),&widget->data->crect);
        pQVar16 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar16->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_d0 = (QWidgetData *)pQVar16->name;
          local_e8 = 2;
          iStack_e4 = 0;
          uStack_e0._0_1_ = (QPaintDevice)0x0;
          uStack_e0._1_3_ = 0;
          uStack_dc = 0;
          local_d4 = 0;
          QMessageLogger::debug();
          QVar7.stream = local_c8.stream;
          QVar29.m_data = (storage_type *)0x1d;
          QVar29.m_size = (qsizetype)&local_88;
          QString::fromUtf8(QVar29);
          QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)&local_88);
          if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
            }
          }
          if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
          }
          *(int *)((QTextStream *)local_c8.stream + 0x28) =
               *(int *)((QTextStream *)local_c8.stream + 0x28) + 1;
          ::operator<<((Stream *)&local_b8,(QWidget *)local_f0);
          QVar7.stream = local_b8.stream;
          QVar30.m_data = (storage_type *)0x4;
          QVar30.m_size = (qsizetype)&local_88;
          QString::fromUtf8(QVar30);
          QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)&local_88);
          if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
            }
          }
          if (*(QTextStream *)(local_b8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_b8.stream,' ');
          }
          QTextStream::operator<<
                    ((QTextStream *)local_b8.stream,(void *)CONCAT44(local_68._4_4_,local_68._0_4_))
          ;
          if (*(QTextStream *)(local_b8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_b8.stream,' ');
          }
          QDebug::~QDebug(&local_b8);
          this_04 = (QDebug *)local_f0;
          goto LAB_0042f366;
        }
      }
      pQVar17 = local_b0;
      QDockAreaLayoutItem::~QDockAreaLayoutItem((QDockAreaLayoutItem *)local_68);
      if (local_a8 == (undefined1  [8])0x0) goto LAB_0042f8d0;
      LOCK();
      *(int *)local_a8 = *(int *)local_a8 + -1;
      iVar11 = *(int *)local_a8;
      UNLOCK();
      auVar24 = local_a8;
      goto joined_r0x0042f8b7;
    }
    pQVar19 = dockInfo(this,*(QWidget **)(*(long *)&widget->field_0x8 + 0x10));
    if (pQVar19 == (QDockAreaLayoutInfo *)0x0) {
      pQVar16 = QtPrivateLogging::lcQpaDockWidgets();
      if (((pQVar16->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
        local_68._24_8_ = pQVar16->name;
        local_68._0_4_ = 2;
        local_68._4_4_ = 0;
        local_68._8_4_ = 0;
        local_68._12_4_ = 0;
        local_68._16_4_ = 0;
        local_68._20_4_ = 0;
        QMessageLogger::debug();
        auVar24 = local_a8;
        QVar31.m_data = &DAT_0000000a;
        QVar31.m_size = (qsizetype)&local_e8;
        QString::fromUtf8(QVar31);
        QTextStream::operator<<((QTextStream *)auVar24,(QString *)&local_e8);
        piVar22 = (int *)CONCAT44(iStack_e4,local_e8);
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(iStack_e4,local_e8),2,0x10);
          }
        }
        if (*(QTextStream *)((long)local_a8 + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_a8,' ');
        }
        *(int *)((long)local_a8 + 0x28) = *(int *)((long)local_a8 + 0x28) + 1;
        local_90 = local_a8;
        ::operator<<((Stream *)&local_88,(QWidget *)local_90);
        this_02 = local_88.d;
        QVar32.m_data = (storage_type *)0x6;
        QVar32.m_size = (qsizetype)&local_e8;
        QString::fromUtf8(QVar32);
        QTextStream::operator<<((QTextStream *)this_02,(QString *)&local_e8);
        piVar22 = (int *)CONCAT44(iStack_e4,local_e8);
        if (piVar22 != (int *)0x0) {
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(iStack_e4,local_e8),2,0x10);
          }
        }
        if ((char)local_88.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_88.d,' ');
        }
        QTextStream::operator<<((QTextStream *)local_88.d,"true");
        if ((char)local_88.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_88.d,' ');
        }
        QDebug::~QDebug((QDebug *)&local_88);
        QDebug::~QDebug((QDebug *)local_90);
        QDebug::~QDebug((QDebug *)local_a8);
      }
      pQVar17 = (QLayoutItem *)0x0;
      goto LAB_0042f8d0;
    }
    local_68._16_4_ = 0xaaaaaaaa;
    local_68._20_4_ = 0xaaaaaaaa;
    local_68._0_4_ = 0xaaaaaaaa;
    local_68._4_4_ = 0xaaaaaaaa;
    local_68._8_4_ = 0xaaaaaaaa;
    local_68._12_4_ = 0xaaaaaaaa;
    QDockAreaLayoutInfo::indexOf
              ((QList<int> *)local_68,pQVar19,*(QWidget **)(*(long *)&widget->field_0x8 + 0x10));
    if (CONCAT44(local_68._20_4_,local_68._16_4_) == 0) {
      pQVar17 = (QLayoutItem *)0x0;
    }
    else {
      pQVar15 = QDockAreaLayoutInfo::item(pQVar19,(QList<int> *)local_68);
      pQVar17 = pQVar15->widgetItem;
    }
    piVar22 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
    if (piVar22 == (int *)0x0) goto LAB_0042f8d0;
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 != 0) goto LAB_0042f8d0;
    auVar24 = (undefined1  [8])CONCAT44(local_68._4_4_,local_68._0_4_);
  }
  QArrayData::deallocate((QArrayData *)auVar24,4,0x10);
LAB_0042f8d0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar17;
}

Assistant:

QLayoutItem *QMainWindowLayout::unplug(QWidget *widget, QDockWidgetPrivate::DragScope scope)
{
#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    auto *groupWindow = qobject_cast<const QDockWidgetGroupWindow *>(widget->parentWidget());
    if (!widget->isWindow() && groupWindow) {
        if (scope == QDockWidgetPrivate::DragScope::Group && groupWindow->tabLayoutInfo()) {
            // We are just dragging a floating window as it, not need to do anything, we just have to
            // look up the corresponding QWidgetItem* if it exists
            if (QDockAreaLayoutInfo *info = dockInfo(widget->parentWidget())) {
                QList<int> groupWindowPath = info->indexOf(widget->parentWidget());
                return groupWindowPath.isEmpty() ? nullptr : info->item(groupWindowPath).widgetItem;
            }
            qCDebug(lcQpaDockWidgets) << "Drag only:" << widget << "Group:" << (scope == QDockWidgetPrivate::DragScope::Group);
            return nullptr;
        }
        QList<int> path = groupWindow->layoutInfo()->indexOf(widget);
        QDockAreaLayoutItem parentItem = groupWindow->layoutInfo()->item(path);
        QLayoutItem *item = parentItem.widgetItem;
        if (scope == QDockWidgetPrivate::DragScope::Group && path.size() > 1
            && unplugGroup(this, &item, parentItem)) {
            qCDebug(lcQpaDockWidgets) << "Unplugging:" << widget << "from" << item;
            return item;
        } else {
            // We are unplugging a single dock widget from a floating window.
            QDockWidget *dockWidget = qobject_cast<QDockWidget *>(widget);
            Q_ASSERT(dockWidget); // cannot be a QDockWidgetGroupWindow because it's not floating.
            dockWidget->d_func()->unplug(widget->geometry());

            qCDebug(lcQpaDockWidgets) << "Unplugged from floating dock:" << widget << "from" << parentItem.widgetItem;
            return item;
        }
    }
#endif
    QList<int> path = layoutState.indexOf(widget);
    if (path.isEmpty())
        return nullptr;

    QLayoutItem *item = layoutState.item(path);
    if (widget->isWindow())
        return item;

    QRect r = layoutState.itemRect(path);
    savedState = layoutState;

#if QT_CONFIG(dockwidget)
    if (QDockWidget *dw = qobject_cast<QDockWidget*>(widget)) {
        Q_ASSERT(path.constFirst() == 1);
#if QT_CONFIG(tabwidget)
        if (scope == QDockWidgetPrivate::DragScope::Group && (dockOptions & QMainWindow::GroupedDragging) && path.size() > 3
            && unplugGroup(this, &item,
                           layoutState.dockAreaLayout.item(path.mid(1, path.size() - 2)))) {
            path.removeLast();
            savedState = layoutState;
        } else
#endif // QT_CONFIG(tabwidget)
        {
            // Dock widget is unplugged from a main window dock
            // => height or width need to be decreased by separator size
            switch (dockWidgetArea(dw)) {
            case Qt::LeftDockWidgetArea:
            case Qt::RightDockWidgetArea:
                r.setHeight(r.height() - sep);
                break;
            case Qt::TopDockWidgetArea:
            case Qt::BottomDockWidgetArea:
                r.setWidth(r.width() - sep);
                break;
            case Qt::NoDockWidgetArea:
            case Qt::DockWidgetArea_Mask:
                break;
            }

            // Depending on the title bar layout (vertical / horizontal),
            // width and height have to provide minimum space for window handles
            // and mouse dragging.
            // Assuming horizontal title bar, if the dock widget does not have a layout.
            const auto *layout = qobject_cast<QDockWidgetLayout *>(dw->layout());
            const bool verticalTitleBar = layout ? layout->verticalTitleBar : false;
            const int tbHeight = QApplication::style()
                      ? QApplication::style()->pixelMetric(QStyle::PixelMetric::PM_TitleBarHeight, nullptr, dw)
                      : 20;
            const int minHeight = verticalTitleBar ? 2 * tbHeight : tbHeight;
            const int minWidth = verticalTitleBar ? tbHeight : 2 * tbHeight;
            r.setSize(r.size().expandedTo(QSize(minWidth, minHeight)));
            qCDebug(lcQpaDockWidgets) << dw << "will be unplugged with size" << r.size();

            dw->d_func()->unplug(r);
        }
    }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(toolbar)
    if (QToolBar *tb = qobject_cast<QToolBar*>(widget)) {
        tb->d_func()->unplug(r);
    }
#endif

#if !QT_CONFIG(dockwidget) || !QT_CONFIG(tabbar)
    Q_UNUSED(scope);
#endif

    layoutState.unplug(path ,&savedState);
    savedState.fitLayout();
    currentGapPos = path;
    currentGapRect = r;
    updateGapIndicator();

    fixToolBarOrientation(item, currentGapPos.at(1));

    return item;
}